

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O0

LispPTR DSK_renamefile(LispPTR *args)

{
  int iVar1;
  LispPTR *pLVar2;
  OneDArray *pOVar3;
  char *pcVar4;
  DLword *pDVar5;
  int *piVar6;
  bool bVar7;
  bool bVar8;
  LispPTR local_6104;
  LispPTR local_60fc;
  int local_60f8;
  int local_60f0;
  char *local_60e8;
  char *lf_cp2;
  char *lf_cp1;
  size_t lf_ii_1;
  size_t lf_i_1;
  char *lf_dptr_1;
  char *lf_sptr_1;
  size_t lf_length_1;
  short *lf_sbase_1;
  char *lf_dp_1;
  char *lf_base_1;
  OneDArray *lf_arrayp_3;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp_2;
  OneDArray *lf_arrayp_1;
  OneDArray *lf_arrayp;
  int local_6030;
  int need_maintain_flg;
  int fatp;
  int rval;
  char ver [16];
  char dir [4096];
  char svless [4096];
  char vless [4096];
  char fbuf [4096];
  char dst [4096];
  char src [4096];
  LispPTR *args_local;
  
  iVar1 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar1 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
    pLVar2 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar2 + 6) == 'C') {
      need_maintain_flg = pLVar2[2];
      local_6030 = 0;
    }
    else if (*(char *)((long)pLVar2 + 6) == 'D') {
      need_maintain_flg = pLVar2[2] << 1;
      local_6030 = 1;
    }
    else {
      error("LispStringLength: Not a character array.\n");
    }
    if (local_6030 == 0) {
      local_60f0 = need_maintain_flg + 3;
    }
    else {
      local_60f0 = need_maintain_flg + 5;
    }
    need_maintain_flg = local_60f0;
    if (local_60f0 < 0x1001) {
      pLVar2 = NativeAligned4FromLAddr(args[1]);
      if (*(char *)((long)pLVar2 + 6) == 'C') {
        need_maintain_flg = pLVar2[2];
        local_6030 = 0;
      }
      else if (*(char *)((long)pLVar2 + 6) == 'D') {
        need_maintain_flg = pLVar2[2] << 1;
        local_6030 = 1;
      }
      else {
        error("LispStringLength: Not a character array.\n");
      }
      if (local_6030 == 0) {
        local_60f8 = need_maintain_flg + 3;
      }
      else {
        local_60f8 = need_maintain_flg + 5;
      }
      need_maintain_flg = local_60f8;
      if (local_60f8 < 0x1001) {
        pLVar2 = NativeAligned4FromLAddr(*args);
        if ((int)pLVar2[2] < 0x1000) {
          local_60fc = pLVar2[2];
        }
        else {
          local_60fc = 0x1000;
        }
        pOVar3 = (OneDArray *)(long)(int)local_60fc;
        if (*(char *)((long)pLVar2 + 6) == 'C') {
          pDVar5 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
          lf_i = (size_t)(vless + 0xff8);
          lf_dptr = (char *)((long)pDVar5 + (long)(int)(uint)(ushort)pLVar2[1]);
          for (lf_ii = 0; lf_ii < pOVar3; lf_ii = lf_ii + 1) {
            *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
            lf_i = lf_i + 1;
            lf_dptr = lf_dptr + 1;
          }
          (vless + 0xff8)[(long)pOVar3] = '\0';
        }
        else if (*(char *)((long)pLVar2 + 6) == 'D') {
          pDVar5 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
          lf_length = (size_t)(pDVar5 + (int)(uint)(ushort)pLVar2[1]);
          lf_sbase = (short *)(vless + 0xff8);
          for (lf_arrayp_3 = (OneDArray *)0x0; lf_arrayp_3 < pOVar3;
              lf_arrayp_3 = (OneDArray *)&lf_arrayp_3->field_0x1) {
            *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
            lf_length = lf_length + 2;
            lf_sbase = (short *)((long)lf_sbase + 1);
          }
          *(undefined1 *)lf_sbase = 0;
        }
        else {
          error("LispStringToCString: Not a character array.\n");
        }
        unixpathname(vless + 0xff8,dst + 0xff8,1,0);
        pLVar2 = NativeAligned4FromLAddr(args[1]);
        if ((int)pLVar2[2] < 0x1000) {
          local_6104 = pLVar2[2];
        }
        else {
          local_6104 = 0x1000;
        }
        pcVar4 = (char *)(long)(int)local_6104;
        if (*(char *)((long)pLVar2 + 6) == 'C') {
          pDVar5 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
          lf_i_1 = (size_t)(vless + 0xff8);
          lf_dptr_1 = (char *)((long)pDVar5 + (long)(int)(uint)(ushort)pLVar2[1]);
          for (lf_ii_1 = 0; lf_ii_1 < pcVar4; lf_ii_1 = lf_ii_1 + 1) {
            *(undefined1 *)lf_i_1 = *(undefined1 *)((ulong)lf_dptr_1 ^ 3);
            lf_i_1 = lf_i_1 + 1;
            lf_dptr_1 = lf_dptr_1 + 1;
          }
          (vless + 0xff8)[(long)pcVar4] = '\0';
        }
        else if (*(char *)((long)pLVar2 + 6) == 'D') {
          pDVar5 = NativeAligned2FromLAddr(*pLVar2 & 0xfffffff);
          lf_length_1 = (size_t)(pDVar5 + (int)(uint)(ushort)pLVar2[1]);
          lf_sbase_1 = (short *)(vless + 0xff8);
          for (lf_cp1 = (char *)0x0; lf_cp1 < pcVar4; lf_cp1 = lf_cp1 + 1) {
            *(char *)lf_sbase_1 = (char)*(undefined2 *)(lf_length_1 ^ 2);
            lf_length_1 = lf_length_1 + 2;
            lf_sbase_1 = (short *)((long)lf_sbase_1 + 1);
          }
          *(undefined1 *)lf_sbase_1 = 0;
        }
        else {
          error("LispStringToCString: Not a character array.\n");
        }
        unixpathname(vless + 0xff8,fbuf + 0xff8,1,0);
        iVar1 = unpack_filename(fbuf + 0xff8,ver + 8,vless + 0xff8,(char *)&fatp,1);
        if (iVar1 == 0) {
          args_local._4_4_ = 0;
        }
        else {
          iVar1 = make_directory(ver + 8);
          if (iVar1 == 0) {
            args_local._4_4_ = 0;
          }
          else {
            lf_cp2 = ver + 8;
            for (local_60e8 = ver + 8; *local_60e8 != '\0'; local_60e8 = local_60e8 + 1) {
              if (*local_60e8 == '/') {
                lf_cp2 = local_60e8;
              }
            }
            if (lf_cp2 == local_60e8 + -1) {
              if (lf_cp2 == ver + 8) {
                strcpy(fbuf + 0xff8,"/");
                strcat(fbuf + 0xff8,vless + 0xff8);
              }
              else {
                strcpy(fbuf + 0xff8,ver + 8);
                strcat(fbuf + 0xff8,vless + 0xff8);
              }
            }
            else {
              strcpy(fbuf + 0xff8,ver + 8);
              strcat(fbuf + 0xff8,"/");
              strcat(fbuf + 0xff8,vless + 0xff8);
            }
            iVar1 = maintain_version(fbuf + 0xff8,0);
            if (iVar1 == 0) {
              args_local._4_4_ = 0;
            }
            else {
              iVar1 = get_version_array(ver + 8,vless + 0xff8);
              if (iVar1 == 0) {
                args_local._4_4_ = 0;
              }
              else {
                if ((char)fatp == '\0') {
                  strcpy(fbuf + 0xff8,vless + 0xff8);
                }
                else {
                  strcpy(fbuf + 0xff8,vless + 0xff8);
                  strcat(fbuf + 0xff8,".~");
                  strcat(fbuf + 0xff8,(char *)&fatp);
                  strcat(fbuf + 0xff8,"~");
                }
                iVar1 = get_new(ver + 8,VA.files,fbuf + 0xff8,vless + 0xff8);
                if (iVar1 == 0) {
                  args_local._4_4_ = 0;
                }
                else {
                  if ((VA.files)->version_no != 0xffffffff) {
                    if (((VA.files)->version_no == 0) && (VA.files[1].version_no == 0xffffffff)) {
                      get_versionless(VA.files,svless + 0xff8,ver + 8);
                      iVar1 = strcmp(fbuf + 0xff8,svless + 0xff8);
                      if (iVar1 != 0) {
                        strcpy(vless + 0xff8,svless + 0xff8);
                        strcat(vless + 0xff8,".~");
                        strcat(vless + 0xff8,"1");
                        strcat(vless + 0xff8,"~");
                        alarm(TIMEOUT_TIME);
                        do {
                          piVar6 = __errno_location();
                          *piVar6 = 0;
                          need_maintain_flg = rename(svless + 0xff8,vless + 0xff8);
                          bVar7 = false;
                          if (need_maintain_flg == -1) {
                            piVar6 = __errno_location();
                            bVar7 = *piVar6 == 4;
                          }
                        } while (bVar7);
                        alarm(0);
                        if (need_maintain_flg == -1) {
                          piVar6 = __errno_location();
                          *Lisp_errno = *piVar6;
                          return 0;
                        }
                      }
                    }
                    else {
                      get_versionless(VA.files,svless + 0xff8,ver + 8);
                      iVar1 = check_vless_link(svless + 0xff8,VA.files,vless + 0xff8,
                                               &need_maintain_flg);
                      if (iVar1 == 0) {
                        return 0;
                      }
                      iVar1 = strcmp(fbuf + 0xff8,vless + 0xff8);
                      if (iVar1 == 0) {
                        alarm(TIMEOUT_TIME);
                        do {
                          piVar6 = __errno_location();
                          *piVar6 = 0;
                          need_maintain_flg = unlink(svless + 0xff8);
                          bVar7 = false;
                          if (need_maintain_flg == -1) {
                            piVar6 = __errno_location();
                            bVar7 = *piVar6 == 4;
                          }
                        } while (bVar7);
                        alarm(0);
                        if (need_maintain_flg == -1) {
                          piVar6 = __errno_location();
                          *Lisp_errno = *piVar6;
                          return 0;
                        }
                      }
                    }
                  }
                  iVar1 = unpack_filename(dst + 0xff8,ver + 8,vless + 0xff8,(char *)&fatp,1);
                  if (iVar1 == 0) {
                    args_local._4_4_ = 0;
                  }
                  else {
                    iVar1 = get_version_array(ver + 8,vless + 0xff8);
                    if (iVar1 == 0) {
                      args_local._4_4_ = 0;
                    }
                    else if ((VA.files)->version_no == 0xffffffff) {
                      args_local._4_4_ = 0;
                    }
                    else {
                      if ((char)fatp == '\0') {
                        strcpy(dst + 0xff8,vless + 0xff8);
                      }
                      else {
                        strcpy(dst + 0xff8,vless + 0xff8);
                        strcat(dst + 0xff8,".~");
                        strcat(dst + 0xff8,(char *)&fatp);
                        strcat(dst + 0xff8,"~");
                      }
                      iVar1 = get_old(ver + 8,VA.files,dst + 0xff8,vless + 0xff8);
                      if (iVar1 == 0) {
                        args_local._4_4_ = 0;
                      }
                      else {
                        iVar1 = get_versionless(VA.files,svless + 0xff8,ver + 8);
                        if (iVar1 == 0) {
                          bVar7 = false;
                        }
                        else {
                          iVar1 = check_vless_link(svless + 0xff8,VA.files,vless + 0xff8,
                                                   &need_maintain_flg);
                          if (iVar1 == 0) {
                            return 0;
                          }
                          iVar1 = strcmp(dst + 0xff8,svless + 0xff8);
                          if ((iVar1 == 0) && (vless[0xff8] != '\0')) {
                            alarm(TIMEOUT_TIME);
                            do {
                              piVar6 = __errno_location();
                              *piVar6 = 0;
                              need_maintain_flg = unlink(vless + 0xff8);
                              bVar7 = false;
                              if (need_maintain_flg == -1) {
                                piVar6 = __errno_location();
                                bVar7 = *piVar6 == 4;
                              }
                            } while (bVar7);
                            alarm(0);
                            if (need_maintain_flg == -1) {
                              piVar6 = __errno_location();
                              *Lisp_errno = *piVar6;
                              return 0;
                            }
                            bVar7 = true;
                          }
                          else {
                            iVar1 = strcmp(dst + 0xff8,vless + 0xff8);
                            if (iVar1 == 0) {
                              alarm(TIMEOUT_TIME);
                              do {
                                piVar6 = __errno_location();
                                *piVar6 = 0;
                                need_maintain_flg = unlink(svless + 0xff8);
                                bVar7 = false;
                                if (need_maintain_flg == -1) {
                                  piVar6 = __errno_location();
                                  bVar7 = *piVar6 == 4;
                                }
                              } while (bVar7);
                              alarm(0);
                              if (need_maintain_flg == -1) {
                                piVar6 = __errno_location();
                                *Lisp_errno = *piVar6;
                                return 0;
                              }
                              bVar7 = true;
                            }
                            else {
                              bVar7 = false;
                            }
                          }
                          strcpy(dir + 0xff8,svless + 0xff8);
                        }
                        alarm(TIMEOUT_TIME);
                        do {
                          piVar6 = __errno_location();
                          *piVar6 = 0;
                          need_maintain_flg = rename(dst + 0xff8,fbuf + 0xff8);
                          bVar8 = false;
                          if (need_maintain_flg == -1) {
                            piVar6 = __errno_location();
                            bVar8 = *piVar6 == 4;
                          }
                        } while (bVar8);
                        alarm(0);
                        if (need_maintain_flg == -1) {
                          piVar6 = __errno_location();
                          *Lisp_errno = *piVar6;
                          args_local._4_4_ = 0;
                        }
                        else {
                          iVar1 = maintain_version(fbuf + 0xff8,0);
                          if (iVar1 == 0) {
                            args_local._4_4_ = 0;
                          }
                          else if ((bVar7) && (iVar1 = maintain_version(dst + 0xff8,0), iVar1 == 0))
                          {
                            args_local._4_4_ = 0;
                          }
                          else {
                            args_local._4_4_ = 0x4c;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        *Lisp_errno = 200;
        args_local._4_4_ = 0;
      }
    }
    else {
      *Lisp_errno = 200;
      args_local._4_4_ = 0;
    }
  }
  else {
    *Lisp_errno = 100;
    args_local._4_4_ = 0;
  }
  return args_local._4_4_;
}

Assistant:

LispPTR DSK_renamefile(LispPTR *args)
{
  char src[MAXPATHLEN], dst[MAXPATHLEN];
  char fbuf[MAXPATHLEN], vless[MAXPATHLEN], svless[MAXPATHLEN];
  char dir[MAXPATHLEN], ver[VERSIONLEN];
  int rval, fatp;
  int need_maintain_flg;
#ifdef DOS
  char drive1[1], drive2[1];
  int extlen1, extlen2; /* len of extension */
  char rawname1[MAXNAMLEN], rawname2[MAXNAMLEN];
#endif /* DOS */

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  LispStringLength(args[0], rval, fatp);
  /*
   * Because of the version number convention, Lisp pathname might
   * be shorter than UNIX one.  For THIN string, the difference
   * is 2 bytes, for FAT string, 4 bytes.  Add 1 byte for NULL
   * terminating character.
   */
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  if (rval > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringLength(args[1], rval, fatp);
  rval = fatp ? rval + 4 + 1 : rval + 2 + 1;
  if (rval > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], fbuf, MAXPATHLEN);
#ifdef DOS
  separate_drive(fbuf, drive1);
  unixpathname(fbuf, src, 1, 0, drive1, &extlen1, rawname1);
#else  /* DOS */
  unixpathname(fbuf, src, 1, 0);
#endif /* DOS */

  LispStringToCString(args[1], fbuf, MAXPATHLEN);
#ifdef DOS
  separate_drive(fbuf, drive2);
  unixpathname(fbuf, dst, 1, 0, drive2, &extlen2, rawname2);
#else  /* DOS */
  unixpathname(fbuf, dst, 1, 0);
#endif /* DOS */

  if (unpack_filename(dst, dir, fbuf, ver, 1) == 0) return (NIL);
  /*
   * The destination file has been recognized as new file.  Thus we have
   * to make sure that the directory exists.
   */
  if (make_directory(dir) == 0) return (NIL);

  /*
   * We maintain the destination to handle the link damaged case correctly.
   */
  ConcDirAndName(dir, fbuf, dst);
  if (maintain_version(dst, 0) == 0) return (NIL);

  if (get_version_array(dir, fbuf) == 0) return (NIL);

  /*
   * Although the file should have been recognized with "new" mode in Lisp
   * code, we have to recognize it again to know the "real" accessible name
   * of it.
   */

  ConcNameAndVersion(fbuf, ver, dst);
  if (get_new(dir, VA.files, dst, fbuf) == 0) return (NIL);

  /*
   * At this point, there are three cases for the destination.  If there is
   * no member of the destination family, there is nothing to do.  If there
   * is only a versionless file and, if the "real" destination is not the
   * versionless, we have to rename it to version 1.  And last case, if the
   * "real" destination file is the file to which the versionless file is linked,
   * we have to unlink the versionless file.
   */
  if (!NoFileP(VA.files)) {
    if (OnlyVersionlessP(VA.files)) {
      get_versionless(VA.files, vless, dir);
      if (strcmp(dst, vless) != 0) {
        ConcNameAndVersion(vless, "1", fbuf);
        TIMEOUT(rval = rename(vless, fbuf));
        if (rval == -1) {
          *Lisp_errno = errno;
          return (NIL);
        }
      }
    } else {
      /*
       * We are sure that the versionless file is linked to one of
       * the higher versioned file here.
       */
      get_versionless(VA.files, vless, dir);
      if (check_vless_link(vless, VA.files, fbuf, &rval) == 0) { return (NIL); }
      if (strcmp(dst, fbuf) == 0) {
        TIMEOUT(rval = unlink(vless));
        if (rval == -1) {
          *Lisp_errno = errno;
          return (NIL);
        }
      }
    }
  }

  if (unpack_filename(src, dir, fbuf, ver, 1) == 0) return (NIL);
  if (get_version_array(dir, fbuf) == 0) return (NIL);

  if (NoFileP(VA.files))
    return (NIL); /*
                   * If the specified file is deleted from
                   * outside of Lisp during the last time
                   * Lisp recognize it and now, this case
                   * will occur.
                   */

  /*
   * Although the file should have been recognized with "old" mode in Lisp
   * code, we have to recognize it again to know the "real" accessible name
   * of it.
   */
  ConcNameAndVersion(fbuf, ver, src);
  if (get_old(dir, VA.files, src, fbuf) == 0) return (NIL);

  if (get_versionless(VA.files, vless, dir) == 0) {
    /*
     * There is no versionless file.  All we have to do is to simply
     * try to rename the specified file.
     */
    need_maintain_flg = 0;
  } else {
    /*
     * If a versionless file exists, we have to check the link status
     * of it, because renaming a versionless file or a file to which a
     * versionless file is linked will destroy the consistency of the
     * version status.
     */
    if (check_vless_link(vless, VA.files, fbuf, &rval) == 0) return (NIL);

    if (strcmp(src, vless) == 0 && *fbuf != '\0') {
      /*
       * At this point, we only unlink the file to which the
       * versionless is linked.  The versionless fill will be
       * renamed later.
       */
      TIMEOUT(rval = unlink(fbuf));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      need_maintain_flg = 1;
    } else if (strcmp(src, fbuf) == 0) {
      TIMEOUT(rval = unlink(vless));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      need_maintain_flg = 1;
    } else {
      need_maintain_flg = 0;
    }
    strcpy(svless, vless);
  }

  /*
   * At this point, src holds the full file name to be renamed, and dst holds
   * the full file name to which src will be renamed.
   */

  TIMEOUT(rval = rename(src, dst));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  /*
   * The destination directory always have to be maintained, because it is
   * now under control of DSK device.
   * The source directory have to be maintained only if need_maintain_flg
   * is on.
   */

  if (maintain_version(dst, 0) == 0) return (NIL);
  if (need_maintain_flg) {
    if (maintain_version(src, 0) == 0) return (NIL);
  }

  return (ATOM_T);
}